

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O0

Index __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
::vine_swap(Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
            *this,Index columnIndex1,Index columnIndex2)

{
  bool bVar1;
  bool bVar2;
  ID_index IVar3;
  Master_chain_matrix *pMVar4;
  Master_chain_matrix *pMVar5;
  bool col2IsNeg;
  bool col1IsNeg;
  Index columnIndex2_local;
  Index columnIndex1_local;
  Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
  *this_local;
  
  bVar1 = _is_negative_in_pair(this,columnIndex1);
  bVar2 = _is_negative_in_pair(this,columnIndex2);
  this_local._4_4_ = columnIndex1;
  if ((bVar1) && (bVar2)) {
    pMVar4 = _matrix(this);
    pMVar5 = _matrix(this);
    IVar3 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
            ::get_pivot(pMVar5,columnIndex1);
    bVar1 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
            ::is_zero_entry(pMVar4,columnIndex2,IVar3);
    if (!bVar1) {
      this_local._4_4_ = _negative_vine_swap(this,columnIndex1,columnIndex2);
    }
  }
  else if (bVar1) {
    pMVar4 = _matrix(this);
    pMVar5 = _matrix(this);
    IVar3 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
            ::get_pivot(pMVar5,columnIndex1);
    bVar1 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
            ::is_zero_entry(pMVar4,columnIndex2,IVar3);
    if (!bVar1) {
      this_local._4_4_ = _negative_positive_vine_swap(this,columnIndex1,columnIndex2);
    }
  }
  else if (bVar2) {
    pMVar4 = _matrix(this);
    pMVar5 = _matrix(this);
    IVar3 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
            ::get_pivot(pMVar5,columnIndex1);
    bVar1 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
            ::is_zero_entry(pMVar4,columnIndex2,IVar3);
    if (!bVar1) {
      this_local._4_4_ = _positive_negative_vine_swap(this,columnIndex1,columnIndex2);
    }
  }
  else {
    pMVar4 = _matrix(this);
    pMVar5 = _matrix(this);
    IVar3 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
            ::get_pivot(pMVar5,columnIndex1);
    bVar1 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
            ::is_zero_entry(pMVar4,columnIndex2,IVar3);
    if (!bVar1) {
      this_local._4_4_ = _positive_vine_swap(this,columnIndex1,columnIndex2);
    }
  }
  return this_local._4_4_;
}

Assistant:

inline typename Chain_vine_swap<Master_matrix>::Index Chain_vine_swap<Master_matrix>::vine_swap(Index columnIndex1,
                                                                                                Index columnIndex2)
{
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    GUDHI_CHECK(CP::are_adjacent(_matrix()->get_pivot(columnIndex1), _matrix()->get_pivot(columnIndex2)),
                std::invalid_argument(
                    "Chain_vine_swap::vine_swap - Columns to be swapped need to be adjacent in the 'real' matrix."));
  }

  const bool col1IsNeg = _is_negative_in_pair(columnIndex1);
  const bool col2IsNeg = _is_negative_in_pair(columnIndex2);

  if (col1IsNeg && col2IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::negative_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _negative_vine_swap(columnIndex1, columnIndex2);
  }

  if (col1IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::negative_positive_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _negative_positive_vine_swap(columnIndex1, columnIndex2);
  }

  if (col2IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::positive_negative_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _positive_negative_vine_swap(columnIndex1, columnIndex2);
  }

  if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
      ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

      CP::positive_transpose(pivot1, pivot2);
      CP::swap_positions(pivot1, pivot2);
    }
    return columnIndex1;
  }
  return _positive_vine_swap(columnIndex1, columnIndex2);
}